

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LR.cpp
# Opt level: O2

void __thiscall lr_grammar::GrammarLR::get_tow_char_index(GrammarLR *this)

{
  pointer pEVar1;
  vector<int,_std::allocator<int>_> *this_00;
  int local_4c;
  vector<int,_std::allocator<int>_> t;
  
  t.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_end_of_storage
       = (pointer)0x0;
  t.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  t.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_4c = 0;
  while( true ) {
    pEVar1 = (this->elements).
             super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(this->elements).
                       super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pEVar1) / 0x48) <=
        (ulong)(long)local_4c) break;
    this_00 = &this->not_finally_charIndex;
    if (pEVar1[local_4c].super_Elem.is_finally != false) {
      this_00 = &this->finally_charIndex;
    }
    std::vector<int,_std::allocator<int>_>::push_back(this_00,&local_4c);
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::push_back(&this->first,&t);
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::push_back(&this->follow,&t);
    local_4c = local_4c + 1;
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&t.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

void GrammarLR::get_tow_char_index(){
    vector<int> t;
    t.clear();

    for (int i = 0; i < elements.size(); i++){
        if (elements[i].is_finally){
            finally_charIndex.push_back(i);
        }
        else
        {
            not_finally_charIndex.push_back(i);
        }
        first.push_back(t);
        follow.push_back(t);

    }

}